

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O3

TPZGeoElSide * __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::SideSubElement
          (TPZGeoElSide *__return_storage_ptr__,TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *this,
          int side,int position)

{
  TPZReference *pTVar1;
  int64_t iVar2;
  ulong uVar3;
  TPZGeoEl *pTVar4;
  ostream *this_00;
  long *plVar5;
  TPZGeoElSide subGeoEl;
  TPZAutoPointer<TPZRefPattern> local_58;
  _func_int **local_50;
  TPZGeoElSide local_48;
  
  pTVar1 = (this->fRefPattern).fRef;
  if ((pTVar1 == (TPZReference *)0x0) || (pTVar1->fPointer == (TPZRefPattern *)0x0)) {
    (__return_storage_ptr__->super_TPZSavable)._vptr_TPZSavable =
         (_func_int **)&PTR__TPZGeoElSide_018f8760;
    __return_storage_ptr__->fGeoEl = (TPZGeoEl *)0x0;
    __return_storage_ptr__->fSide = -1;
  }
  else {
    local_50 = (_func_int **)&PTR__TPZGeoElSide_018f8760;
    local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
    local_48.fGeoEl = (TPZGeoEl *)0x0;
    local_48.fSide = -1;
    (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>).super_TPZGeoEl +
                0x2b0))(&local_58);
    TPZRefPattern::SideSubGeoElSide((local_58.fRef)->fPointer,side,position,&local_48);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&local_58);
    iVar2 = TPZGeoElSide::Id(&local_48);
    if ((this->fSubEl).fStore[iVar2] == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TPZGeoElRefPattern<TGeo>::SideSubElement : Error subelement not found for side ",
                 0x4f);
      this_00 = (ostream *)std::ostream::operator<<(&std::cerr,side);
      std::__ostream_insert<char,std::char_traits<char>>(this_00," position ",10);
      plVar5 = (long *)std::ostream::operator<<(this_00,position);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      local_48.fSide = -1;
      pTVar4 = (TPZGeoEl *)0x0;
    }
    else {
      uVar3 = TPZGeoElSide::Id(&local_48);
      pTVar4 = (TPZGeoEl *)
               (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>).
                                      super_TPZGeoEl + 0x1f8))(this,uVar3 & 0xffffffff);
    }
    (__return_storage_ptr__->super_TPZSavable)._vptr_TPZSavable = local_50;
    __return_storage_ptr__->fGeoEl = pTVar4;
    __return_storage_ptr__->fSide = local_48.fSide;
  }
  return __return_storage_ptr__;
}

Assistant:

TPZGeoElSide TPZGeoElRefPattern<TGeo>::SideSubElement(int side,int position){
	TPZGeoElSide tmp;
	if(!fRefPattern) return tmp;
	TPZGeoElSide subGeoEl;
	this->GetRefPattern()->SideSubGeoElSide(side,position,subGeoEl);
	if (fSubEl[subGeoEl.Id()] == -1) {
		PZError << "TPZGeoElRefPattern<TGeo>::SideSubElement : Error subelement not found for side "
		<< side << " position " << position << std::endl;
		return TPZGeoElSide();
	}
	return TPZGeoElSide (SubElement(subGeoEl.Id()),subGeoEl.Side());
}